

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_finished(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  st_ptls_traffic_protection_t *enc;
  size_t rec_start;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  undefined1 local_34;
  undefined1 local_33 [3];
  
  rec_start = sendbuf->off;
  iVar2 = ptls_buffer__do_pushv(sendbuf,local_33,3);
  if (iVar2 == 0) {
    iVar2 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar2 == 0) {
      sVar1 = sendbuf->off;
      iVar2 = ptls_buffer__do_pushv(sendbuf,&local_34,1);
      if (iVar2 == 0) {
        iVar2 = ptls_buffer__do_pushv(sendbuf,"",3);
        if (iVar2 == 0) {
          sVar6 = sendbuf->off;
          iVar2 = ptls_buffer_reserve(sendbuf,(tls->key_schedule->hashes[0].algo)->digest_size);
          if (iVar2 == 0) {
            enc = &(tls->traffic_protection).enc;
            iVar2 = calc_verify_data(sendbuf->base + sendbuf->off,tls->key_schedule,enc);
            if (iVar2 == 0) {
              sVar3 = sendbuf->off + (tls->key_schedule->hashes[0].algo)->digest_size;
              sendbuf->off = sVar3;
              uVar4 = sVar3 - sVar6;
              for (lVar5 = 0x10; lVar5 != -8; lVar5 = lVar5 + -8) {
                sendbuf->base[sVar6 - 3] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
                sVar6 = sVar6 + 1;
              }
              sVar6 = sendbuf->off;
              if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                key_schedule_update_hash(tls->key_schedule,sendbuf->base + sVar1,sVar6 - sVar1);
                sVar6 = sendbuf->off;
              }
              sendbuf->base[sVar1 - 2] = (uint8_t)(sVar6 - sVar1 >> 8);
              sendbuf->base[sVar1 - 1] = (uint8_t)(sVar6 - sVar1);
              iVar2 = buffer_encrypt_record(sendbuf,rec_start,enc);
              return iVar2;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret;

    buffer_push_handshake(sendbuf, tls->key_schedule, &tls->traffic_protection.enc, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(sendbuf->base + sendbuf->off, tls->key_schedule, tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}